

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,EndpointDeclaration *e)

{
  ASTObject *pAVar1;
  bool bVar2;
  string *name;
  EndpointDetails *pEVar3;
  Identifier *args;
  pool_ptr<soul::AST::Expression> local_68 [3];
  CompileMessage local_50;
  EndpointDeclaration *local_18;
  EndpointDeclaration *e_local;
  PostResolutionChecks *this_local;
  
  local_18 = e;
  e_local = (EndpointDeclaration *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,e);
  name = Identifier::operator_cast_to_string_(&local_18->name);
  bVar2 = heart::isReservedFunctionName(name);
  if (bVar2) {
    pAVar1 = &local_18->super_ASTObject;
    Errors::invalidEndpointName<soul::Identifier&>(&local_50,(Errors *)&local_18->name,args);
    AST::Context::throwError(&pAVar1->context,&local_50,false);
  }
  bVar2 = AST::EndpointDeclaration::isResolved(local_18);
  if (bVar2) {
    checkEndpointDataTypes(local_18);
    pEVar3 = AST::EndpointDeclaration::getDetails(local_18);
    local_68[0].object = (pEVar3->arraySize).object;
    checkArraySize(this,local_68,0x100);
    pool_ptr<soul::AST::Expression>::~pool_ptr(local_68);
  }
  return;
}

Assistant:

void visit (AST::EndpointDeclaration& e) override
        {
            super::visit (e);

            if (heart::isReservedFunctionName (e.name))
                e.context.throwError (Errors::invalidEndpointName (e.name));

            if (e.isResolved())
            {
                checkEndpointDataTypes (e);
                checkArraySize (e.getDetails().arraySize, AST::maxEndpointArraySize);
            }
        }